

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffclose(bifcxdef *ctx,int argc)

{
  FILE *__stream;
  undefined4 in_ESI;
  int *in_RDI;
  osfildef *fp;
  int fnum;
  int in_stack_fffffffffffffff0;
  
  __stream = (FILE *)bif_get_file((bifcxdef *)fp,in_RDI,
                                  (int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  fclose(__stream);
  (in_RDI + (long)in_stack_fffffffffffffff0 * 4 + 0xc)[0] = 0;
  (in_RDI + (long)in_stack_fffffffffffffff0 * 4 + 0xc)[1] = 0;
  return;
}

Assistant:

void biffclose(bifcxdef *ctx, int argc)
{
    int       fnum;
    osfildef *fp;

    /* get the file number */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, &fnum, 0);

    /* close the file and release the slot */
    osfcls(fp);
    ctx->bifcxfile[fnum].fp = 0;
}